

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

ActionResultHolder<unsigned_short> *
testing::internal::ActionResultHolder<unsigned_short>::PerformDefaultAction<unsigned_short()>
          (FunctionMocker<unsigned_short_()> *func_mocker,ArgumentTuple *args,
          string *call_description)

{
  Result_conflict RVar1;
  ActionResultHolder<unsigned_short> *pAVar2;
  
  pAVar2 = (ActionResultHolder<unsigned_short> *)operator_new(0x10);
  RVar1 = FunctionMocker<unsigned_short_()>::PerformDefaultAction(func_mocker,args,call_description)
  ;
  (pAVar2->super_UntypedActionResultHolderBase)._vptr_UntypedActionResultHolderBase =
       (_func_int **)&PTR__UntypedActionResultHolderBase_00274a48;
  (pAVar2->result_).value_ = RVar1;
  return pAVar2;
}

Assistant:

static ActionResultHolder* PerformDefaultAction(
      const FunctionMocker<F>* func_mocker,
      typename Function<F>::ArgumentTuple&& args,
      const std::string& call_description) {
    return new ActionResultHolder(Wrapper(func_mocker->PerformDefaultAction(
        std::move(args), call_description)));
  }